

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O1

bool __thiscall
gl4cts::SparseTexture2CommitmentTestCase::verifyTextureData
          (SparseTexture2CommitmentTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level)

{
  undefined1 *this_00;
  pointer *__x;
  _Alloc_hider _Var1;
  undefined8 uVar2;
  GLint GVar3;
  GLint GVar4;
  pointer puVar5;
  pointer puVar6;
  pointer __s;
  GLenum GVar7;
  ostream *poVar8;
  size_t sVar9;
  TestError *this_01;
  deUint32 dVar10;
  int iVar11;
  undefined4 in_register_0000000c;
  size_type sVar12;
  SparseTexture2CommitmentTestCase *pSVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  Functions *pFVar20;
  bool bVar21;
  bool bVar22;
  GLint depth;
  GLint height;
  GLint width;
  GLenum local_40c;
  TransferFormat local_408;
  GLuint verifyTexture;
  TextureFormat *local_3f8;
  GLint local_3f0;
  int local_3ec;
  ulong local_3e8;
  SparseTexture2CommitmentTestCase *local_3e0;
  ulong local_3d8;
  Functions *local_3d0;
  ulong local_3c8;
  ostream *local_3c0;
  string shader;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecOutData;
  string local_378;
  string local_358;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecExpData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecExpData_1;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_288;
  undefined1 local_268 [32];
  TokenStrings s;
  ShaderProgram program;
  
  local_3d8 = CONCAT44(in_register_0000000c,format);
  this_00 = &(this->super_SparseTextureCommitmentTestCase).field_0x88;
  local_3d0 = gl;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Verify Texture [level: ",0x17);
  local_3c0 = (ostream *)this_00;
  poVar8 = (ostream *)std::ostream::operator<<(this_00,level);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] - ",4);
  if ((this->super_SparseTextureCommitmentTestCase).mState.levels + -1 < level) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Invalid level",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
               ,0x442);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_408 = glu::getTransferFormat((this->super_SparseTextureCommitmentTestCase).mState.format);
  SparseTextureUtils::getTextureLevelSize
            (target,&(this->super_SparseTextureCommitmentTestCase).mState,level,&width,&height,
             &depth);
  pFVar20 = local_3d0;
  GVar3 = depth;
  local_3e8 = (ulong)(uint)width;
  if (height == 0 || width + 1U < 3) {
    return true;
  }
  if (depth < (this->super_SparseTextureCommitmentTestCase).mState.minDepth) {
    return true;
  }
  local_3f8 = &(this->super_SparseTextureCommitmentTestCase).mState.format;
  local_3c8 = (ulong)local_408 >> 0x20;
  local_3ec = width / 2;
  local_40c = target;
  if (target == 0x8513) {
    s.format._M_dataplus._M_p = (pointer)0x0;
    s.format._M_string_length = 0;
    s.format.field_2._M_allocated_capacity = 0;
    vecExpData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(vecExpData_1.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,0x8515);
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              ((vector<int,_std::allocator<int>_> *)&s,(iterator)0x0,(int *)&vecExpData_1);
    vecExpData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(vecExpData_1.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,0x8516);
    if (s.format._M_string_length == s.format.field_2._M_allocated_capacity) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                ((vector<int,_std::allocator<int>_> *)&s,(iterator)s.format._M_string_length,
                 (int *)&vecExpData_1);
    }
    else {
      *(undefined4 *)s.format._M_string_length = 0x8516;
      s.format._M_string_length = s.format._M_string_length + 4;
    }
    vecExpData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(vecExpData_1.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,0x8517);
    if (s.format._M_string_length == s.format.field_2._M_allocated_capacity) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                ((vector<int,_std::allocator<int>_> *)&s,(iterator)s.format._M_string_length,
                 (int *)&vecExpData_1);
    }
    else {
      *(undefined4 *)s.format._M_string_length = 0x8517;
      s.format._M_string_length = s.format._M_string_length + 4;
    }
    vecExpData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(vecExpData_1.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,0x8518);
    if (s.format._M_string_length == s.format.field_2._M_allocated_capacity) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                ((vector<int,_std::allocator<int>_> *)&s,(iterator)s.format._M_string_length,
                 (int *)&vecExpData_1);
    }
    else {
      *(undefined4 *)s.format._M_string_length = 0x8518;
      s.format._M_string_length = s.format._M_string_length + 4;
    }
    vecExpData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(vecExpData_1.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,0x8519);
    if (s.format._M_string_length == s.format.field_2._M_allocated_capacity) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                ((vector<int,_std::allocator<int>_> *)&s,(iterator)s.format._M_string_length,
                 (int *)&vecExpData_1);
    }
    else {
      *(undefined4 *)s.format._M_string_length = 0x8519;
      s.format._M_string_length = s.format._M_string_length + 4;
    }
    vecExpData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(vecExpData_1.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,0x851a);
    if (s.format._M_string_length == s.format.field_2._M_allocated_capacity) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                ((vector<int,_std::allocator<int>_> *)&s,(iterator)s.format._M_string_length,
                 (int *)&vecExpData_1);
    }
    else {
      *(undefined4 *)s.format._M_string_length = 0x851a;
      s.format._M_string_length = s.format._M_string_length + 4;
    }
    GVar4 = width;
    GVar3 = height;
    iVar14 = tcu::TextureFormat::getPixelSize(local_3f8);
    vecExpData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vecExpData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vecExpData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pSVar13 = (SparseTexture2CommitmentTestCase *)(long)(GVar3 * GVar4 * iVar14);
    local_3f0 = level;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&vecExpData_1,(size_type)pSVar13);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&program,(size_type)pSVar13)
    ;
    __s = program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
          _M_impl.super__Vector_impl_data._M_start;
    puVar5 = vecExpData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memset(vecExpData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,0xff,(size_t)pSVar13);
    if ((pointer)s.format._M_string_length == s.format._M_dataplus._M_p) {
      bVar22 = true;
    }
    else {
      bVar22 = true;
      uVar17 = 0;
      local_3e0 = pSVar13;
      do {
        pSVar13 = local_3e0;
        GVar7 = *(GLenum *)(s.format._M_dataplus._M_p + uVar17 * 4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_3c0,"Verify Subtarget [subtarget: ",0x1d);
        poVar8 = (ostream *)std::ostream::operator<<(local_3c0,GVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] - ",4);
        memset(__s,0x7f,(size_t)pSVar13);
        gl4cts::Texture::GetData(local_3d0,local_3f0,GVar7,local_408.format,(GLenum)local_3c8,__s);
        GVar7 = (*local_3d0->getError)();
        glu::checkError(GVar7,"Texture::GetData",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0x490);
        local_3d8 = uVar17;
        if (1 < (int)local_3e8) {
          iVar14 = 0;
          do {
            if (0 < height) {
              iVar16 = 0;
              do {
                if (0 < depth) {
                  iVar15 = 0;
                  do {
                    iVar18 = tcu::TextureFormat::getPixelSize(local_3f8);
                    lVar19 = (long)((width * iVar16 + iVar14) * iVar18);
                    iVar18 = bcmp(puVar5 + lVar19,(void *)(lVar19 + (long)__s),(long)iVar18);
                    if (iVar18 != 0) {
                      bVar22 = false;
                    }
                    iVar15 = iVar15 + 1;
                  } while (iVar15 < depth);
                }
                iVar16 = iVar16 + 1;
              } while (iVar16 < height);
            }
            iVar14 = iVar14 + 1;
          } while (iVar14 != local_3ec);
        }
      } while ((bVar22) &&
              (uVar17 = local_3d8 + 1,
              uVar17 < (ulong)((long)(s.format._M_string_length - (long)s.format._M_dataplus._M_p)
                              >> 2)));
    }
    if (program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(program.m_shaders[0].
                      super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)program.m_shaders[0].
                            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)program.m_shaders[0].
                            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    local_3e0 = this;
    if ((target == 0x9100) || (target == 0x9102)) {
      if ((target | 2U) != 0x9102) {
        return true;
      }
      vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      sVar12 = (size_type)(height * width * depth);
      local_3f0 = level;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecExpData,sVar12);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecOutData,sVar12);
      puVar6 = vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar5 = vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      memset(vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,0xff,sVar12);
      dVar10 = 0x8c1a;
      if (local_40c == 0x9100) {
        dVar10 = 0xde1;
      }
      local_408.format = dVar10;
      gl4cts::Texture::Generate(pFVar20,&verifyTexture);
      gl4cts::Texture::Bind(pFVar20,verifyTexture,local_408.format);
      gl4cts::Texture::Storage(pFVar20,local_408.format,1,0x8229,width,height,depth);
      GVar7 = (*pFVar20->getError)();
      glu::checkError(GVar7,"Texture::Storage",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                      ,0x4bb);
      if ((local_3e0->super_SparseTextureCommitmentTestCase).mState.samples < 1) {
        bVar22 = true;
      }
      else {
        bVar22 = true;
        local_3f8 = (TextureFormat *)((ulong)local_3f8 & 0xffffffff00000000);
        local_3c8 = sVar12;
        do {
          memset(puVar5,0,local_3c8);
          gl4cts::Texture::Bind(pFVar20,verifyTexture,local_408.format);
          gl4cts::Texture::SubImage
                    (pFVar20,local_408.format,0,0,0,0,width,height,depth,0x1903,0x1401,puVar5);
          GVar7 = (*pFVar20->getError)();
          glu::checkError(GVar7,"Texture::SubImage",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0x4c4);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&shader,st2_compute_textureVerify,(allocator<char> *)&s);
          local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"image","");
          local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
          pSVar13 = (SparseTexture2CommitmentTestCase *)0x1be54c4;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"image","");
          createShaderTokens(&s,pSVar13,local_40c,(GLint)local_3d8,(GLint)local_3f8,&local_378,
                             &local_358);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358._M_dataplus._M_p != &local_358.field_2) {
            operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._M_dataplus._M_p != &local_378.field_2) {
            operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
          }
          replaceToken("<OUTPUT_TYPE>",s.outputType._M_dataplus._M_p,&shader);
          replaceToken("<FORMAT>",s.format._M_dataplus._M_p,&shader);
          replaceToken("<INPUT_TYPE>",s.inputType._M_dataplus._M_p,&shader);
          replaceToken("<POINT_TYPE>",s.pointType._M_dataplus._M_p,&shader);
          replaceToken("<POINT_DEF>",s.pointDef._M_dataplus._M_p,&shader);
          replaceToken("<RETURN_TYPE>",s.returnType._M_dataplus._M_p,&shader);
          replaceToken("<SAMPLE_DEF>",s.sampleDef._M_dataplus._M_p,&shader);
          replaceToken("<RESULT_EXPECTED>",s.resultExpected._M_dataplus._M_p,&shader);
          replaceToken("<EPSILON>",s.epsilon._M_dataplus._M_p,&shader);
          local_268[0x10] = 0;
          local_268._17_8_ = 0;
          local_268._0_8_ = (pointer)0x0;
          local_268[8] = 0;
          local_268._9_7_ = 0;
          memset(&vecExpData_1,0,0xac);
          program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(program.m_shaders[0].
                                 super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,5);
          program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)(program.m_shaders + 1);
          __x = &program.m_shaders[0].
                 super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)__x,shader._M_dataplus._M_p,
                     shader._M_dataplus._M_p + shader._M_string_length);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(&vecExpData_1 +
                         ((ulong)program.m_shaders[0].
                                 super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start & 0xffffffff)),
                      (value_type *)__x);
          if ((vector<glu::Shader_*,_std::allocator<glu::Shader_*>_> *)
              program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
              ._M_impl.super__Vector_impl_data._M_finish != program.m_shaders + 1) {
            operator_delete(program.m_shaders[0].
                            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish,
                            (long)program.m_shaders[1].
                                  super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 1);
          }
          glu::ShaderProgram::ShaderProgram
                    (&program,((local_3e0->super_SparseTextureCommitmentTestCase).super_TestCase.
                              m_context)->m_renderCtx,(ProgramSources *)&vecExpData_1);
          pFVar20 = local_3d0;
          if (program.m_program.m_info.linkOk == true) {
            (*local_3d0->useProgram)(program.m_program.m_program);
            GVar7 = (*pFVar20->getError)();
            glu::checkError(GVar7,"glUseProgram",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x4dd);
            (*pFVar20->bindImageTexture)(0,verifyTexture,0,'\0',0,0x88b9,0x8232);
            GVar7 = (*pFVar20->getError)();
            glu::checkError(GVar7,"glBindImageTexture",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x4e4);
            (*pFVar20->bindImageTexture)(1,*texture,local_3f0,'\0',0,35000,(GLenum)local_3d8);
            GVar7 = (*pFVar20->getError)();
            glu::checkError(GVar7,"glBindImageTexture",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x4eb);
            (*pFVar20->uniform1i)(1,0);
            GVar7 = (*pFVar20->getError)();
            glu::checkError(GVar7,"glUniform1i",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x4ed);
            (*pFVar20->uniform1i)(2,1);
            GVar7 = (*pFVar20->getError)();
            glu::checkError(GVar7,"glUniform1i",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x4ef);
            (*pFVar20->dispatchCompute)(width,height,depth);
            GVar7 = (*pFVar20->getError)();
            glu::checkError(GVar7,"glDispatchCompute",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x4f1);
            (*pFVar20->memoryBarrier)(0xffffffff);
            GVar7 = (*pFVar20->getError)();
            glu::checkError(GVar7,"glMemoryBarrier",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x4f3);
            gl4cts::Texture::GetData(pFVar20,0,local_408.format,0x1903,0x1401,puVar5);
            GVar7 = (*pFVar20->getError)();
            glu::checkError(GVar7,"Texture::GetData",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x4f6);
            if (1 < (int)local_3e8) {
              iVar14 = 0;
              do {
                if (0 < height) {
                  iVar15 = 0;
                  iVar16 = iVar14;
                  do {
                    uVar17 = (ulong)(uint)depth;
                    iVar18 = iVar16;
                    if (0 < depth) {
                      do {
                        if (puVar6[iVar18] != puVar5[iVar18]) {
                          bVar22 = false;
                        }
                        iVar18 = iVar18 + height * width;
                        uVar17 = uVar17 - 1;
                      } while (uVar17 != 0);
                    }
                    iVar15 = iVar15 + 1;
                    iVar16 = iVar16 + width;
                  } while (iVar15 != height);
                }
                iVar14 = iVar14 + 1;
              } while (iVar14 != local_3ec);
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_3c0,"Compute shader compilation failed (reading) for target: ",0x38);
            poVar8 = (ostream *)std::ostream::operator<<(local_3c0,local_40c);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", format: ",10);
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)local_3d8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", infoLog: ",0xb);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,((*program.m_shaders[5].
                                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->m_info).
                                       infoLog._M_dataplus._M_p,
                                ((*program.m_shaders[5].
                                   super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_info).infoLog.
                                _M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", shaderSource: ",0x10);
            _Var1 = shader._M_dataplus;
            if (shader._M_dataplus._M_p == (pointer)0x0) {
              std::ios::clear((int)poVar8 + (int)poVar8->_vptr_basic_ostream[-3]);
            }
            else {
              sVar9 = strlen(shader._M_dataplus._M_p);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,_Var1._M_p,sVar9);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," - ",3);
            bVar22 = false;
          }
          glu::ShaderProgram::~ShaderProgram(&program);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_268);
          std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::
          ~vector(&local_288);
          lVar19 = 0x78;
          do {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&vecExpData_1.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar19));
            lVar19 = lVar19 + -0x18;
          } while (lVar19 != -0x18);
          TokenStrings::~TokenStrings(&s);
          pFVar20 = local_3d0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)shader._M_dataplus._M_p != &shader.field_2) {
            operator_delete(shader._M_dataplus._M_p,shader.field_2._M_allocated_capacity + 1);
          }
          iVar14 = (GLint)local_3f8 + 1;
          local_3f8 = (TextureFormat *)CONCAT44(local_3f8._4_4_,iVar14);
        } while (iVar14 < (local_3e0->super_SparseTextureCommitmentTestCase).mState.samples);
      }
      gl4cts::Texture::Delete(pFVar20,&verifyTexture);
      _Var1._M_p = (pointer)vecExpData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
      uVar2 = vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
      if (vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)vecOutData.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)vecOutData.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        _Var1._M_p = (pointer)vecExpData.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start;
        uVar2 = vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage;
      }
      goto joined_r0x00a6858a;
    }
    iVar16 = height * width;
    iVar14 = tcu::TextureFormat::getPixelSize(local_3f8);
    s.format.field_2._M_allocated_capacity = 0;
    s.format._M_dataplus._M_p = (pointer)0x0;
    s.format._M_string_length = 0;
    vecExpData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vecExpData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vecExpData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    sVar12 = (size_type)(GVar3 * iVar14 * iVar16);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&s,sVar12);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecExpData_1,sVar12);
    _Var1 = s.format._M_dataplus;
    puVar5 = vecExpData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memset(s.format._M_dataplus._M_p,0xff,sVar12);
    memset(puVar5,0x7f,sVar12);
    gl4cts::Texture::GetData(pFVar20,level,local_40c,local_408.format,(GLenum)local_3c8,puVar5);
    GVar7 = (*pFVar20->getError)();
    glu::checkError(GVar7,"Texture::GetData",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                    ,0x463);
    bVar22 = true;
    if (1 < (int)local_3e8) {
      bVar21 = true;
      bVar22 = true;
      iVar14 = 0;
      do {
        if (0 < height) {
          iVar16 = 0;
          do {
            if (0 < depth) {
              iVar15 = 0;
              bVar22 = bVar21;
              do {
                iVar18 = tcu::TextureFormat::getPixelSize(local_3f8);
                iVar11 = (width * iVar16 + iVar14) * iVar18;
                iVar18 = bcmp(_Var1._M_p + iVar11,puVar5 + iVar11,(long)iVar18);
                if (iVar18 != 0) {
                  bVar22 = false;
                }
                iVar15 = iVar15 + 1;
                bVar21 = bVar22;
              } while (iVar15 < depth);
            }
            iVar16 = iVar16 + 1;
          } while (iVar16 < height);
        }
        iVar14 = iVar14 + 1;
      } while (iVar14 != local_3ec);
    }
  }
  _Var1._M_p = s.format._M_dataplus._M_p;
  uVar2 = s.format.field_2._M_allocated_capacity;
  if (vecExpData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vecExpData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)vecExpData_1.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vecExpData_1.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
    _Var1 = s.format._M_dataplus;
    uVar2 = s.format.field_2._M_allocated_capacity;
  }
joined_r0x00a6858a:
  if ((pointer)_Var1._M_p != (pointer)0x0) {
    operator_delete(_Var1._M_p,uVar2 - (long)_Var1._M_p);
  }
  return bVar22;
}

Assistant:

bool SparseTexture2CommitmentTestCase::verifyTextureData(const Functions& gl, GLint target, GLint format,
														 GLuint& texture, GLint level)
{
	mLog << "Verify Texture [level: " << level << "] - ";

	if (level > mState.levels - 1)
		TCU_FAIL("Invalid level");

	TransferFormat transferFormat = glu::getTransferFormat(mState.format);

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	//Committed region is limited to 1/2 of width
	GLint widthCommitted = width / 2;

	if (widthCommitted == 0 || height == 0 || depth < mState.minDepth)
		return true;

	bool result = true;

	if (target != GL_TEXTURE_CUBE_MAP && target != GL_TEXTURE_2D_MULTISAMPLE &&
		target != GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
	{
		GLint texSize = width * height * depth * mState.format.getPixelSize();

		std::vector<GLubyte> vecExpData;
		std::vector<GLubyte> vecOutData;
		vecExpData.resize(texSize);
		vecOutData.resize(texSize);
		GLubyte* exp_data = vecExpData.data();
		GLubyte* out_data = vecOutData.data();

		deMemset(exp_data, 255, texSize);
		deMemset(out_data, 127, texSize);

		Texture::GetData(gl, level, target, transferFormat.format, transferFormat.dataType, (GLvoid*)out_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::GetData");

		//Verify only committed region
		for (GLint x = 0; x < widthCommitted; ++x)
			for (GLint y = 0; y < height; ++y)
				for (GLint z = 0; z < depth; ++z)
				{
					int		 pixelSize	 = mState.format.getPixelSize();
					GLubyte* dataRegion	= exp_data + ((x + y * width) * pixelSize);
					GLubyte* outDataRegion = out_data + ((x + y * width) * pixelSize);
					if (deMemCmp(dataRegion, outDataRegion, pixelSize) != 0)
						result = false;
				}
	}
	else if (target == GL_TEXTURE_CUBE_MAP)
	{
		std::vector<GLint> subTargets;

		subTargets.push_back(GL_TEXTURE_CUBE_MAP_POSITIVE_X);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_NEGATIVE_X);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_POSITIVE_Y);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_POSITIVE_Z);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z);

		GLint texSize = width * height * mState.format.getPixelSize();

		std::vector<GLubyte> vecExpData;
		std::vector<GLubyte> vecOutData;
		vecExpData.resize(texSize);
		vecOutData.resize(texSize);
		GLubyte* exp_data = vecExpData.data();
		GLubyte* out_data = vecOutData.data();

		deMemset(exp_data, 255, texSize);

		for (size_t i = 0; i < subTargets.size(); ++i)
		{
			GLint subTarget = subTargets[i];

			mLog << "Verify Subtarget [subtarget: " << subTarget << "] - ";

			deMemset(out_data, 127, texSize);

			Texture::GetData(gl, level, subTarget, transferFormat.format, transferFormat.dataType, (GLvoid*)out_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::GetData");

			//Verify only committed region
			for (GLint x = 0; x < widthCommitted; ++x)
				for (GLint y = 0; y < height; ++y)
					for (GLint z = 0; z < depth; ++z)
					{
						int		 pixelSize	 = mState.format.getPixelSize();
						GLubyte* dataRegion	= exp_data + ((x + y * width) * pixelSize);
						GLubyte* outDataRegion = out_data + ((x + y * width) * pixelSize);
						if (deMemCmp(dataRegion, outDataRegion, pixelSize) != 0)
							result = false;
					}

			if (!result)
				break;
		}
	}
	// For multisample texture use compute shader to verify image data
	else if (target == GL_TEXTURE_2D_MULTISAMPLE || target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
	{
		GLint texSize = width * height * depth;

		std::vector<GLubyte> vecExpData;
		std::vector<GLubyte> vecOutData;
		vecExpData.resize(texSize);
		vecOutData.resize(texSize);
		GLubyte* exp_data = vecExpData.data();
		GLubyte* out_data = vecOutData.data();

		deMemset(exp_data, 255, texSize);

		// Create verifying texture
		GLint verifyTarget;
		if (target == GL_TEXTURE_2D_MULTISAMPLE)
			verifyTarget = GL_TEXTURE_2D;
		else
			verifyTarget = GL_TEXTURE_2D_ARRAY;

		GLuint verifyTexture;
		Texture::Generate(gl, verifyTexture);
		Texture::Bind(gl, verifyTexture, verifyTarget);
		Texture::Storage(gl, verifyTarget, 1, GL_R8, width, height, depth);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::Storage");

		for (int sample = 0; sample < mState.samples; ++sample)
		{
			deMemset(out_data, 0, texSize);

			Texture::Bind(gl, verifyTexture, verifyTarget);
			Texture::SubImage(gl, verifyTarget, 0, 0, 0, 0, width, height, depth, GL_RED, GL_UNSIGNED_BYTE,
							  (GLvoid*)out_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::SubImage");

			std::string shader = st2_compute_textureVerify;

			// Adjust shader source to texture format
			TokenStrings s = createShaderTokens(target, format, sample);

			replaceToken("<OUTPUT_TYPE>", s.outputType.c_str(), shader);
			replaceToken("<FORMAT>", s.format.c_str(), shader);
			replaceToken("<INPUT_TYPE>", s.inputType.c_str(), shader);
			replaceToken("<POINT_TYPE>", s.pointType.c_str(), shader);
			replaceToken("<POINT_DEF>", s.pointDef.c_str(), shader);
			replaceToken("<RETURN_TYPE>", s.returnType.c_str(), shader);
			replaceToken("<SAMPLE_DEF>", s.sampleDef.c_str(), shader);
			replaceToken("<RESULT_EXPECTED>", s.resultExpected.c_str(), shader);
			replaceToken("<EPSILON>", s.epsilon.c_str(), shader);

			ProgramSources sources;
			sources << ComputeSource(shader);

			// Build and run shader
			ShaderProgram program(m_context.getRenderContext(), sources);
			if (program.isOk())
			{
				gl.useProgram(program.getProgram());
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram");
				gl.bindImageTexture(0, //unit
									verifyTexture,
									0,		  //level
									GL_FALSE, //layered
									0,		  //layer
									GL_WRITE_ONLY, GL_R8UI);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture");
				gl.bindImageTexture(1, //unit
									texture,
									level,	//level
									GL_FALSE, //layered
									0,		  //layer
									GL_READ_ONLY, format);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture");
				gl.uniform1i(1, 0 /* image_unit */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
				gl.uniform1i(2, 1 /* image_unit */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
				gl.dispatchCompute(width, height, depth);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute");
				gl.memoryBarrier(GL_ALL_BARRIER_BITS);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glMemoryBarrier");

				Texture::GetData(gl, 0, verifyTarget, GL_RED, GL_UNSIGNED_BYTE, (GLvoid*)out_data);
				GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::GetData");

				//Verify only committed region
				for (GLint x = 0; x < widthCommitted; ++x)
					for (GLint y = 0; y < height; ++y)
						for (GLint z = 0; z < depth; ++z)
						{
							GLubyte* dataRegion	= exp_data + ((x + y * width) + z * width * height);
							GLubyte* outDataRegion = out_data + ((x + y * width) + z * width * height);
							if (dataRegion[0] != outDataRegion[0])
								result = false;
						}
			}
			else
			{
				mLog << "Compute shader compilation failed (reading) for target: " << target << ", format: " << format
					 << ", infoLog: " << program.getShaderInfo(SHADERTYPE_COMPUTE).infoLog
					 << ", shaderSource: " << shader.c_str() << " - ";

				result = false;
			}
		}

		Texture::Delete(gl, verifyTexture);
	}

	return result;
}